

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildInt2
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot srcRegSlot)

{
  code *pcVar1;
  int iVar2;
  IRType fromType;
  bool bVar3;
  ValueType VVar4;
  IntConstOpnd *this_00;
  RegOpnd *this_01;
  IntConstOpnd *src2Opnd;
  undefined4 *puVar5;
  Instr *instr;
  IntConstOpnd *pIVar6;
  Func *pFVar7;
  undefined6 in_register_00000032;
  OpCode OVar8;
  
  this_00 = (IntConstOpnd *)BuildSrcOpnd(this,srcRegSlot,TyInt32);
  VVar4 = ValueType::GetInt(false);
  IR::Opnd::SetValueType((Opnd *)this_00,VVar4);
  this_01 = BuildDstOpnd(this,dstRegSlot,TyInt32);
  VVar4 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_01->super_Opnd,VVar4);
  iVar2 = (int)CONCAT62(in_register_00000032,newOpcode);
  switch(iVar2) {
  case 0x60:
    pFVar7 = this->m_func;
    OVar8 = Neg_I4;
    break;
  case 0x61:
    pFVar7 = this->m_func;
    OVar8 = Not_I4;
    break;
  case 0x62:
switchD_004bbd9d_caseD_62:
    src2Opnd = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
    pFVar7 = this->m_func;
    OVar8 = CmEq_I4;
    goto LAB_004bbee3;
  case 99:
    src2Opnd = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
    pFVar7 = this->m_func;
    OVar8 = CmNeq_I4;
LAB_004bbee3:
    instr = IR::Instr::New(OVar8,&this_01->super_Opnd,&this_00->super_Opnd,&src2Opnd->super_Opnd,
                           pFVar7);
    goto LAB_004bbefe;
  default:
    if (iVar2 != 10) {
      if (iVar2 != 0x10a) {
        if (iVar2 == 0x47) {
          instr = IR::Instr::New(Ld_I4,&this_01->super_Opnd,(Opnd *)this_00,this->m_func);
          CheckJitLoopReturn(this,dstRegSlot,TyInt32);
          goto LAB_004bbefe;
        }
        if (iVar2 == 0x48) {
          fromType = TyInt8;
        }
        else {
          if (iVar2 != 0x49) {
            if (iVar2 == 0x73) {
              pFVar7 = this->m_func;
              OVar8 = PopCnt;
            }
            else {
              if (iVar2 == 0x9b) goto switchD_004bbd9d_caseD_62;
              if (iVar2 == 0xb7) {
                pFVar7 = this->m_func;
                OVar8 = InlineMathAbs;
              }
              else if (iVar2 == 0xbb) {
                pFVar7 = this->m_func;
                OVar8 = InlineMathClz;
              }
              else {
                if (iVar2 != 0xbc) {
                  if (iVar2 != 0x29) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                    *puVar5 = 1;
                    bVar3 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                                       ,0x9c9,"((0))","(0)");
                    if (!bVar3) {
                      pcVar1 = (code *)invalidInstructionException();
                      (*pcVar1)();
                    }
                    *puVar5 = 0;
                    instr = (Instr *)0x0;
                    goto LAB_004bbefe;
                  }
                  SwitchIRBuilder::BeginSwitch(&this->m_switchBuilder);
                  goto LAB_004bbd81;
                }
                pFVar7 = this->m_func;
                OVar8 = Ctz;
              }
            }
            break;
          }
          fromType = TyInt16;
        }
        instr = CreateSignExtendInstr(this,&this_01->super_Opnd,(Opnd *)this_00,fromType);
        goto LAB_004bbefe;
      }
      pIVar6 = (IntConstOpnd *)BuildSrcOpnd(this,3,TyVar);
      pFVar7 = this->m_func;
      OVar8 = GrowWasmMemory;
      src2Opnd = this_00;
      this_00 = pIVar6;
      goto LAB_004bbee3;
    }
LAB_004bbd81:
    pFVar7 = this->m_func;
    OVar8 = Ld_I4;
  }
  instr = IR::Instr::New(OVar8,&this_01->super_Opnd,(Opnd *)this_00,pFVar7);
LAB_004bbefe:
  AddInstr(this,instr,offset);
  if (newOpcode != GrowMemory) {
    return;
  }
  BuildHeapBufferReload(this,offset,false);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildInt2(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(srcRegSlot, TyInt32);
    srcOpnd->SetValueType(ValueType::GetInt(false));

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
    dstOpnd->SetValueType(ValueType::GetInt(false));

    IR::Instr * instr = nullptr;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::BeginSwitch_Int:
        m_switchBuilder.BeginSwitch();
        // fall-through
    case Js::OpCodeAsmJs::Ld_Int:
        instr = IR::Instr::New(Js::OpCode::Ld_I4, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Neg_Int:
        instr = IR::Instr::New(Js::OpCode::Neg_I4, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Not_Int:
        instr = IR::Instr::New(Js::OpCode::Not_I4, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::LogNot_Int:
        instr = IR::Instr::New(Js::OpCode::CmEq_I4, dstOpnd, srcOpnd, IR::IntConstOpnd::New(0, TyInt32, m_func), m_func);
        break;

    case Js::OpCodeAsmJs::Conv_ITB:
        instr = IR::Instr::New(Js::OpCode::CmNeq_I4, dstOpnd, srcOpnd, IR::IntConstOpnd::New(0, TyInt32, m_func), m_func);
        break;

    case Js::OpCodeAsmJs::Abs_Int:
        instr = IR::Instr::New(Js::OpCode::InlineMathAbs, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Clz32_Int:
        instr = IR::Instr::New(Js::OpCode::InlineMathClz, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Ctz_Int:
        instr = IR::Instr::New(Js::OpCode::Ctz, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::PopCnt_Int:
        instr = IR::Instr::New(Js::OpCode::PopCnt, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Return_Int:
        instr = IR::Instr::New(Js::OpCode::Ld_I4, dstOpnd, srcOpnd, m_func);
        CheckJitLoopReturn(dstRegSlot, TyInt32);
        break;

    case Js::OpCodeAsmJs::Eqz_Int:
        instr = IR::Instr::New(Js::OpCode::CmEq_I4, dstOpnd, srcOpnd, IR::IntConstOpnd::New(0, TyInt32, m_func), m_func);
        break;

    case Js::OpCodeAsmJs::GrowMemory:
        instr = IR::Instr::New(Js::OpCode::GrowWasmMemory, dstOpnd, BuildSrcOpnd(AsmJsRegSlots::WasmMemoryReg, TyVar), srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::I32Extend8_s:
        instr = CreateSignExtendInstr(dstOpnd, srcOpnd, TyInt8);
        break;
    case Js::OpCodeAsmJs::I32Extend16_s:
        instr = CreateSignExtendInstr(dstOpnd, srcOpnd, TyInt16);
        break;
    default:
        Assume(UNREACHED);
    }

    AddInstr(instr, offset);

    if (newOpcode == Js::OpCodeAsmJs::GrowMemory)
    {
        BuildHeapBufferReload(offset);
    }
}